

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

void __thiscall
cs_impl::
cni_holder<const_char_*(cni_root_namespace::child::foo::*)(const_char_*),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(cni_root_namespace::child::foo_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
::cni_holder(cni_holder<const_char_*(cni_root_namespace::child::foo::*)(const_char_*),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(cni_root_namespace::child::foo_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             *this,offset_in_foo_to_subr *func)

{
  function<const_char_*(cni_root_namespace::child::foo_&,_const_char_*)> *in_RDI;
  cni_helper<const_char_*(*)(cni_root_namespace::child::foo_&,_const_char_*),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(cni_root_namespace::child::foo_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *this_00;
  offset_in_foo_to_subr *in_stack_ffffffffffffffc8;
  function<const_char_*(cni_root_namespace::child::foo_&,_const_char_*)> *in_stack_ffffffffffffffd0;
  
  cni_holder_base::cni_holder_base((cni_holder_base *)in_RDI);
  *(undefined ***)&(in_RDI->super__Function_base)._M_functor = &PTR__cni_holder_006c38e8;
  this_00 = (cni_helper<const_char_*(*)(cni_root_namespace::child::foo_&,_const_char_*),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(cni_root_namespace::child::foo_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             *)((long)&(in_RDI->super__Function_base)._M_functor + 8);
  std::function<char_const*(cni_root_namespace::child::foo&,char_const*)>::
  function<char_const*(cni_root_namespace::child::foo::*const&)(char_const*),void>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  cni_helper<const_char_*(*)(cni_root_namespace::child::foo_&,_const_char_*),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(cni_root_namespace::child::foo_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::cni_helper(this_00,in_RDI);
  std::function<const_char_*(cni_root_namespace::child::foo_&,_const_char_*)>::~function
            ((function<const_char_*(cni_root_namespace::child::foo_&,_const_char_*)> *)0x4379d6);
  return;
}

Assistant:

explicit cni_holder(const T &func) : mCni(func) {}